

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

wchar_t ma_strcpy_s(char *dst,size_t dstSizeInBytes,char *src)

{
  bool bVar1;
  ulong local_30;
  size_t i;
  char *src_local;
  size_t dstSizeInBytes_local;
  char *dst_local;
  
  if (dst == (char *)0x0) {
    dst_local._4_4_ = L'\x16';
  }
  else if (dstSizeInBytes == 0) {
    dst_local._4_4_ = L'\"';
  }
  else if (src == (char *)0x0) {
    *dst = '\0';
    dst_local._4_4_ = L'\x16';
  }
  else {
    local_30 = 0;
    while( true ) {
      bVar1 = false;
      if (local_30 < dstSizeInBytes) {
        bVar1 = src[local_30] != '\0';
      }
      if (!bVar1) break;
      dst[local_30] = src[local_30];
      local_30 = local_30 + 1;
    }
    if (local_30 < dstSizeInBytes) {
      dst[local_30] = '\0';
      dst_local._4_4_ = L'\0';
    }
    else {
      *dst = '\0';
      dst_local._4_4_ = L'\"';
    }
  }
  return dst_local._4_4_;
}

Assistant:

MA_API int ma_strcpy_s(char* dst, size_t dstSizeInBytes, const char* src)
{
    size_t i;

    if (dst == 0) {
        return 22;
    }
    if (dstSizeInBytes == 0) {
        return 34;
    }
    if (src == 0) {
        dst[0] = '\0';
        return 22;
    }

    for (i = 0; i < dstSizeInBytes && src[i] != '\0'; ++i) {
        dst[i] = src[i];
    }

    if (i < dstSizeInBytes) {
        dst[i] = '\0';
        return 0;
    }

    dst[0] = '\0';
    return 34;
}